

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.h
# Opt level: O0

bool ispring::File::FileCopy(string *src,string *dst)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  streambuf *psVar3;
  undefined1 local_428 [8];
  ofstream f2;
  undefined1 local_228 [8];
  ifstream f1;
  string *dst_local;
  string *src_local;
  
  std::ifstream::ifstream(local_228,(string *)src,_S_bin);
  _Var2 = std::operator|(_S_trunc,_S_bin);
  std::ofstream::ofstream(local_428,(string *)dst,_Var2);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    bVar1 = std::ofstream::is_open();
    if ((bVar1 & 1) != 0) {
      psVar3 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_428,psVar3);
      std::ofstream::close();
      std::ifstream::close();
      src_local._7_1_ = true;
      goto LAB_001743cc;
    }
  }
  std::ifstream::close();
  std::ofstream::close();
  src_local._7_1_ = false;
LAB_001743cc:
  std::ofstream::~ofstream(local_428);
  std::ifstream::~ifstream(local_228);
  return src_local._7_1_;
}

Assistant:

inline bool FileCopy(std::string src, std::string dst) {
			//https://stackoverflow.com/questions/3680730/c-fileio-copy-vs-systemcp-file1-x-file2-x
			std::ifstream f1 (src, std::fstream::binary);
			std::ofstream f2 (dst, std::fstream::trunc|std::fstream::binary);
			if(f1.is_open()==false || f2.is_open()==false){
				f1.close();
				f2.close();
				return false;
			}
			f2 << f1.rdbuf ();
			f2.close();
			f1.close();
			return true;
		}